

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableMultiplicationGeneralizationImpl.hpp
# Opt level: O0

void __thiscall
Inferences::VariableMultiplicationGeneralizationImpl::Preprocess::operator()
          (Preprocess *this,
          Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
          *p)

{
  SymbolId v;
  SymbolId v_00;
  bool bVar1;
  int iVar2;
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
  *in_RSI;
  Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *in_RDI;
  Elem var;
  StlIter __end0_1;
  StlIter __begin0_1;
  IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:132:21),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:140:31),_Kernel::Variable>_>
  *__range5;
  int cur;
  IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:132:21),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:140:31),_Kernel::Variable>_>
  vars;
  VariableRegion varStack;
  IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:132:21),_false>_>
  varIter2;
  IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:132:21),_false>_>
  varIter;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> summand;
  StlIter __end0;
  StlIter __begin0;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
  *__range3;
  undefined4 in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd6c;
  int in_stack_fffffffffffffd70;
  uint in_stack_fffffffffffffd74;
  Elem in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd90;
  int iVar3;
  Elem in_stack_fffffffffffffdb0;
  Elem in_stack_fffffffffffffdb4;
  VariableRegion *in_stack_fffffffffffffdc0;
  VariableRegion *in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffde0;
  int in_stack_fffffffffffffde4;
  Preprocess *in_stack_fffffffffffffde8;
  int local_1d0;
  IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:132:21),_false>_>
  local_1c8;
  IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:132:21),_false>_>
  local_188 [2];
  undefined1 local_108 [64];
  undefined1 local_c8 [32];
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
  local_a8 [2];
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
  local_68 [3];
  undefined1 local_38 [32];
  undefined1 *local_18;
  
  Lib::
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
  ::operator->(in_RSI);
  Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::iterSummands
            ((Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
             CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
  local_18 = local_38;
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>_>
  ::begin((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
           *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>_>
  ::end((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
         *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  while (bVar1 = Lib::operator!=((StlIter *)
                                 CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                                 (StlIter *)
                                 CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68)),
        bVar1) {
    Lib::
    IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>_>
    ::StlIter::operator*((StlIter *)0x73f8bb);
    Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::Monom
              (in_stack_fffffffffffffd80,
               (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
               CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78._num));
    Lib::
    Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
    ::operator->(local_68);
    Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>::iter
              ((MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
               CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    Lib::
    IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>>,unsigned_long>(Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>>const&,unsigned_long)::{lambda(auto:1)#1},Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>const&>>
    ::operator()(local_a8,local_c8);
    Lib::
    IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>>,unsigned_long>(Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>>const&,unsigned_long)::{lambda(auto:1)#1},Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>const&>,Inferences::VariableMultiplicationGeneralizationImpl::Preprocess::TEMPNAMEPLACEHOLDERVALUE(Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Lib::PerfectIdComparison>)::{lambda(Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>)#1},false>>
    ::operator()((IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:132:21),_false>_>
                  *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                 (IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:132:21),_false>_>
                  *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    Lib::
    IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>>,unsigned_long>(Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>>const&,unsigned_long)::{lambda(auto:1)#1},Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>const&>,Inferences::VariableMultiplicationGeneralizationImpl::Preprocess::TEMPNAMEPLACEHOLDERVALUE(Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Lib::PerfectIdComparison>)::{lambda(Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>)#1},false>>
    ::operator()(local_188,local_108);
    Lib::
    IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:132:21),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:137:18),_Inferences::AnyNumber<Kernel::MonomFactor>_>_>
    ::collect<Lib::Stack>
              ((IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:132:21),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:137:18),_Inferences::AnyNumber<Kernel::MonomFactor>_>_>
                *)in_RDI);
    VariableRegion::VariableRegion
              ((VariableRegion *)
               CONCAT44(in_stack_fffffffffffffdb4._num,in_stack_fffffffffffffdb0._num),in_RDI);
    Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::~Stack
              ((Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *)
               CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    Lib::
    IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>>,unsigned_long>(Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>>const&,unsigned_long)::{lambda(auto:1)#1},Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>const&>,Inferences::VariableMultiplicationGeneralizationImpl::Preprocess::TEMPNAMEPLACEHOLDERVALUE(Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Lib::PerfectIdComparison>)::{lambda(Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>)#1},false>>
    ::operator()(&local_1c8,local_a8);
    bVar1 = Lib::
            IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:132:21),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:140:31),_Kernel::Variable>_>
            ::hasNext((IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:132:21),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:140:31),_Kernel::Variable>_>
                       *)0x73f98e);
    if (bVar1) {
      Lib::
      IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:132:21),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:140:31),_Kernel::Variable>_>
      ::next((IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:132:21),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:140:31),_Kernel::Variable>_>
              *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      v.kind = in_stack_fffffffffffffd78._num;
      v.functor = in_stack_fffffffffffffd74;
      local_1d0 = root((Preprocess *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),v
                      );
      iVar3 = local_1d0;
      varSet((Preprocess *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
             in_stack_fffffffffffffd6c);
      VariableRegion::VariableRegion
                ((VariableRegion *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                 (VariableRegion *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      VariableRegion::meet(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
      in_stack_fffffffffffffd80 =
           (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
           varSet((Preprocess *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                  in_stack_fffffffffffffd6c);
      VariableRegion::operator=
                ((VariableRegion *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                 (VariableRegion *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      VariableRegion::~VariableRegion((VariableRegion *)0x73fa5f);
      VariableRegion::~VariableRegion((VariableRegion *)0x73fa69);
      Lib::
      IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:132:21),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:140:31),_Kernel::Variable>_>
      ::begin((IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:132:21),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:140:31),_Kernel::Variable>_>
               *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      Lib::
      IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:132:21),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:140:31),_Kernel::Variable>_>
      ::end((IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:132:21),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:140:31),_Kernel::Variable>_>
             *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      while( true ) {
        bVar1 = Lib::operator()((StlIter *)
                                CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                                (StlIter *)
                                CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
        in_stack_fffffffffffffd7c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd7c);
        if (!bVar1) break;
        in_stack_fffffffffffffd78 =
             Lib::
             IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:132:21),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:140:31),_Kernel::Variable>_>
             ::StlIter::operator*
                       ((StlIter *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
        v_00.kind = in_stack_fffffffffffffd78._num;
        v_00.functor = in_stack_fffffffffffffd74;
        in_stack_fffffffffffffdb0 = in_stack_fffffffffffffd78;
        in_stack_fffffffffffffdb4 = in_stack_fffffffffffffd78;
        in_stack_fffffffffffffd74 =
             root((Preprocess *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),v_00);
        iVar2 = joinRegions(in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
                            in_stack_fffffffffffffde0);
        in_stack_fffffffffffffd6c = iVar2;
        Lib::
        IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:132:21),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:140:31),_Kernel::Variable>_>
        ::StlIter::operator++((StlIter *)CONCAT44(iVar3,in_stack_fffffffffffffd90));
        in_stack_fffffffffffffd70 = local_1d0;
        local_1d0 = iVar2;
      }
      Lib::
      IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:132:21),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:140:31),_Kernel::Variable>_>
      ::StlIter::~StlIter((StlIter *)0x73fac7);
      Lib::
      IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:132:21),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:140:31),_Kernel::Variable>_>
      ::StlIter::~StlIter((StlIter *)0x73fad1);
    }
    VariableRegion::~VariableRegion((VariableRegion *)0x73fc3b);
    Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::~Monom
              ((Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x73fc48);
    Lib::
    IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>_>
    ::StlIter::operator++((StlIter *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
  }
  return;
}

Assistant:

void operator()(Perfect<Polynom<NumTraits>> p) 
  {
    for (auto summand : p->iterSummands()) {

      auto varIter = summand.factors->iter()
            .filter([](MonomFactor<NumTraits> factor) { return factor.term.template is<Variable>(); });

      auto varIter2 = varIter;
      auto varStack = VariableRegion(
          varIter2
            .map([](MonomFactor<NumTraits> factor) { return AnyNumber<MonomFactor>(factor); })
            .template collect<Stack>());

      auto vars = varIter.map([](MonomFactor<NumTraits> factor) { return factor.term.template unwrap<Variable>(); });

      if (vars.hasNext())  {
        auto cur = root(vars.next());

        varSet(cur) = std::move(varSet(cur)).meet(std::move(varStack));

        for (auto var : vars) {
          cur = joinRegions(cur, root(var));
        }

      }
    }
  }